

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall QFSFileEnginePrivate::unmap(QFSFileEnginePrivate *this,uchar *ptr)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QFSFileEngine *pQVar4;
  StartAndLength *pSVar5;
  void *__addr;
  QAbstractFileEngine *in_RSI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  const_iterator it_00;
  size_t len;
  uchar *start;
  QFSFileEngine *q;
  const_iterator it;
  uchar **in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  const_iterator *in_stack_ffffffffffffff38;
  FileError error;
  FileError error_00;
  QAbstractFileEngine *in_stack_ffffffffffffff40;
  QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *in_stack_ffffffffffffff48;
  bool local_71;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  error_00 = (FileError)((ulong)pQVar4 >> 0x20);
  it_00 = QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::find
                    ((QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *)
                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28);
  QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::cend
            ((QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *)
             in_stack_ffffffffffffff38);
  bVar2 = QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::const_iterator::operator==
                    (in_stack_ffffffffffffff38,
                     (const_iterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
                    );
  error = (FileError)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (bVar2) {
    qt_error_string(error);
    QAbstractFileEngine::setError
              (in_stack_ffffffffffffff40,error,
               (QString *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    QString::~QString((QString *)0x18e820);
    local_71 = false;
  }
  else {
    pSVar5 = QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::const_iterator::
             operator->((const_iterator *)0x18e844);
    __addr = (void *)((long)in_RSI - (long)pSVar5->start);
    pSVar5 = QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::const_iterator::
             operator->((const_iterator *)0x18e869);
    iVar3 = munmap(__addr,pSVar5->length);
    if (iVar3 == -1) {
      __errno_location();
      qt_error_string(error_00);
      QAbstractFileEngine::setError
                (in_RSI,error_00,
                 (QString *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      QString::~QString((QString *)0x18e8c5);
      local_71 = false;
    }
    else {
      QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::erase
                (in_stack_ffffffffffffff48,it_00);
      local_71 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_71;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::unmap(uchar *ptr)
{
#if !defined(Q_OS_INTEGRITY)
    Q_Q(QFSFileEngine);
    const auto it = std::as_const(maps).find(ptr);
    if (it == maps.cend()) {
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        return false;
    }

    uchar *start = ptr - it->start;
    size_t len = it->length;
    if (-1 == munmap(start, len)) {
        q->setError(QFile::UnspecifiedError, qt_error_string(errno));
        return false;
    }
    maps.erase(it);
    return true;
#else
    return false;
#endif
}